

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

int __thiscall asmjit::CodeHolder::init(CodeHolder *this,EVP_PKEY_CTX *ctx)

{
  size_t *psVar1;
  ulong uVar2;
  int extraout_EAX;
  Error EVar3;
  int iVar4;
  void *pvVar5;
  undefined4 extraout_var;
  CodeHolder *unaff_RBX;
  ulong unaff_RBP;
  undefined4 uVar6;
  CodeEmitter *emitter;
  undefined8 unaff_R12;
  ulong unaff_R13;
  size_t unaff_R14;
  ZoneVector<asmjit::SectionEntry_*> *unaff_R15;
  
  do {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(size_t *)((long)register0x00000020 + -0x10) = unaff_R14;
    *(CodeHolder **)((long)register0x00000020 + -0x18) = unaff_RBX;
    unaff_RBP = 7;
    if ((this->_codeInfo)._archInfo.field_0.field_0._type != '\0') {
LAB_00113dc8:
      return (int)unaff_RBP;
    }
    if (this->_emitters != (CodeEmitter *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x20) = 0x113dd4;
      init((EVP_PKEY_CTX *)this);
LAB_00113dd4:
      unaff_RBP = 1;
LAB_00113d58:
      *(undefined8 *)((long)register0x00000020 + -0x20) = 0x113d66;
      Zone::reset(&this->_baseZone,false);
      goto LAB_00113dc8;
    }
    if ((this->_sections).super_ZoneVectorBase._capacity ==
        (this->_sections).super_ZoneVectorBase._length) {
      *(undefined8 *)((long)register0x00000020 + -0x20) = 0x113d52;
      EVar3 = ZoneVectorBase::_grow(&(this->_sections).super_ZoneVectorBase,&this->_baseHeap,8,1);
      unaff_RBP = (ulong)EVar3;
      if (EVar3 == 0) goto LAB_00113d68;
      goto LAB_00113d58;
    }
LAB_00113d68:
    unaff_RBX = (CodeHolder *)&this->_baseZone;
    uVar6 = 0x58;
    *(undefined8 *)((long)register0x00000020 + -0x20) = 0x113d76;
    pvVar5 = Zone::allocZeroed((Zone *)unaff_RBX,0x58);
    if (pvVar5 == (void *)0x0) goto LAB_00113dd4;
    *(undefined4 *)((long)pvVar5 + 4) = 3;
    *(undefined8 *)((long)pvVar5 + 0x10) = 0x747865742e;
    uVar2 = (this->_sections).super_ZoneVectorBase._length;
    if (uVar2 < (this->_sections).super_ZoneVectorBase._capacity) {
      *(void **)((long)(this->_sections).super_ZoneVectorBase._data + uVar2 * 8) = pvVar5;
      psVar1 = &(this->_sections).super_ZoneVectorBase._length;
      *psVar1 = *psVar1 + 1;
      (this->_codeInfo)._archInfo.field_0 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)ctx;
      (this->_codeInfo).field_1 = *(anon_union_4_2_314a35c9_for_CodeInfo_1 *)((long)ctx + 4);
      (this->_codeInfo)._baseAddress = *(uint64_t *)((long)ctx + 8);
      unaff_RBP = 0;
      goto LAB_00113dc8;
    }
    *(undefined8 *)((long)register0x00000020 + -0x20) = 0x113de3;
    iVar4 = init((EVP_PKEY_CTX *)unaff_RBX);
    *(ulong *)((long)register0x00000020 + -0x20) = unaff_RBP;
    *(ZoneVector<asmjit::SectionEntry_*> **)((long)register0x00000020 + -0x28) = unaff_R15;
    *(EVP_PKEY_CTX **)((long)register0x00000020 + -0x30) = ctx;
    *(ulong *)((long)register0x00000020 + -0x38) = unaff_R13;
    *(undefined8 *)((long)register0x00000020 + -0x40) = unaff_R12;
    *(CodeHolder **)((long)register0x00000020 + -0x48) = this;
    *(ulong *)((long)register0x00000020 + -0x50) = CONCAT44(extraout_var,iVar4);
    *(undefined4 *)((long)register0x00000020 + -0x4c) = uVar6;
    emitter = unaff_RBX->_emitters;
    this = unaff_RBX;
    while (emitter != (CodeEmitter *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x58) = 0x113c2b;
      this = unaff_RBX;
      detach(unaff_RBX,emitter);
      emitter = unaff_RBX->_emitters;
    }
    (unaff_RBX->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
    (unaff_RBX->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
    (unaff_RBX->_codeInfo)._baseAddress = 0xffffffffffffffff;
    unaff_RBX->_globalHints = 0;
    unaff_RBX->_globalOptions = 0;
    unaff_R15 = &unaff_RBX->_sections;
    unaff_RBX->_logger = (Logger *)0x0;
    unaff_RBX->_errorHandler = (ErrorHandler *)0x0;
    unaff_RBX->_unresolvedLabelsCount = 0;
    unaff_RBX->_trampolinesSize = 0;
    unaff_R14 = (unaff_RBX->_sections).super_ZoneVectorBase._length;
    if (unaff_R14 == 0) {
LAB_00113c9e:
      *(undefined8 *)((long)register0x00000020 + -0x58) = 0x113cb4;
      ZoneHashBase::reset(&(unaff_RBX->_namedLabels).super_ZoneHashBase,&unaff_RBX->_baseHeap);
      (unaff_RBX->_relocations).super_ZoneVectorBase._data = (void *)0x0;
      (unaff_RBX->_relocations).super_ZoneVectorBase._length = 0;
      (unaff_RBX->_labels).super_ZoneVectorBase._length = 0;
      (unaff_RBX->_labels).super_ZoneVectorBase._capacity = 0;
      (unaff_RBX->_sections).super_ZoneVectorBase._capacity = 0;
      (unaff_RBX->_labels).super_ZoneVectorBase._data = (void *)0x0;
      (unaff_R15->super_ZoneVectorBase)._data = (void *)0x0;
      (unaff_RBX->_sections).super_ZoneVectorBase._length = 0;
      (unaff_RBX->_relocations).super_ZoneVectorBase._capacity = 0;
      *(undefined8 *)((long)register0x00000020 + -0x58) = 0x113ce1;
      ZoneHeap::reset(&unaff_RBX->_baseHeap,&unaff_RBX->_baseZone);
      Zone::reset(&unaff_RBX->_baseZone,*(bool *)((long)register0x00000020 + -0x4c));
      return extraout_EAX;
    }
    unaff_R12 = 0;
    unaff_R13 = 0;
    ctx = (EVP_PKEY_CTX *)0x0;
    while (unaff_R13 < (unaff_RBX->_sections).super_ZoneVectorBase._length) {
      unaff_RBP = *(ulong *)((long)(unaff_R15->super_ZoneVectorBase)._data + unaff_R13 * 8);
      this = *(CodeHolder **)(unaff_RBP + 0x38);
      if ((this != (CodeHolder *)0x0) && (*(char *)(unaff_RBP + 0x50) == '\0')) {
        *(undefined8 *)((long)register0x00000020 + -0x58) = 0x113c8e;
        free(this);
      }
      *(undefined8 *)(unaff_RBP + 0x38) = 0;
      *(undefined8 *)(unaff_RBP + 0x48) = 0;
      unaff_R13 = unaff_R13 + 1;
      if (unaff_R14 == unaff_R13) goto LAB_00113c9e;
    }
    *(undefined8 *)((long)register0x00000020 + -0x58) = 0x113d01;
    CodeHolder_resetInternal();
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x50);
  } while( true );
}

Assistant:

Error CodeHolder::init(const CodeInfo& info) noexcept {
  // Cannot reinitialize if it's locked or there is one or more CodeEmitter
  // attached.
  if (isInitialized())
    return DebugUtils::errored(kErrorAlreadyInitialized);

  // If we are just initializing there should be no emitters attached).
  ASMJIT_ASSERT(_emitters == nullptr);

  // Create the default section and insert it to the `_sections` array.
  Error err = _sections.willGrow(&_baseHeap);
  if (err == kErrorOk) {
    SectionEntry* se = _baseZone.allocZeroedT<SectionEntry>();
    if (ASMJIT_LIKELY(se)) {
      se->_flags = SectionEntry::kFlagExec | SectionEntry::kFlagConst;
      se->_setDefaultName('.', 't', 'e', 'x', 't');
      _sections.appendUnsafe(se);
    }
    else {
      err = DebugUtils::errored(kErrorNoHeapMemory);
    }
  }

  if (ASMJIT_UNLIKELY(err)) {
    _baseZone.reset(false);
    return err;
  }
  else {
    _codeInfo = info;
    return kErrorOk;
  }
}